

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentMap.cpp
# Opt level: O2

void __thiscall EnvironmentMap::Reset(EnvironmentMap *this)

{
  __shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_hdr_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>,
             &local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_hdr_image_view).
              super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2> *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_alias_table_image).
              super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_alias_table_image_view).
              super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2> *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

void EnvironmentMap::Reset() {
	m_hdr_image = nullptr;
	m_hdr_image_view = nullptr;
	m_alias_table_image = nullptr;
	m_alias_table_image_view = nullptr;
}